

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true,false,true>>>
::
Intrusive_list_column<std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,true,false,true>>>
           *this,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>_>
                 *column,Index columnIndex,
          vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
          *rowContainer,Column_settings *colSettings)

{
  iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>::Matrix_column_tag,_1U>_*,_false>
  iVar1;
  Field_operators *pFVar2;
  node_ptr plVar3;
  iterator local_30;
  
  *(Index *)this = columnIndex;
  *(vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
    **)(this + 8) = rowContainer;
  *(undefined8 *)(this + 0x10) = *(undefined8 *)&column->super_Column_dimension_option;
  *(Index *)(this + 0x18) = (column->super_Chain_column_option).pairedColumn_;
  pFVar2 = (Field_operators *)0x0;
  if (colSettings == (Column_settings *)0x0) {
    pFVar2 = column->operators_;
  }
  *(Field_operators **)(this + 0x20) = pFVar2;
  if (colSettings == (Column_settings *)0x0) {
    colSettings = (Column_settings *)column->entryPool_;
  }
  *(Column_settings **)(this + 0x28) = colSettings;
  iVar1.nodeptr_ = (list_node<void_*> *)(this + 0x30);
  *(list_node<void_*> **)(this + 0x30) = iVar1.nodeptr_;
  *(list_node<void_*> **)(this + 0x38) = iVar1.nodeptr_;
  plVar3 = (node_ptr)&column->column_;
  while (plVar3 = (((type *)&plVar3->next_)->data_).root_plus_size_.m_header.super_node.next_,
        plVar3 != (node_ptr)&column->column_) {
    local_30.members_.nodeptr_ =
         (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>::Matrix_column_tag,_1U>_*,_false>
          )(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>::Matrix_column_tag,_1U>_*,_false>
            )iVar1.nodeptr_;
    Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>_>
    ::_insert_entry((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true,_false,_true>_>_>
                     *)this,*(ID_index *)&plVar3[1].next_,&local_30);
  }
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(const Intrusive_list_column& column,
                                                                   Index columnIndex,
                                                                   Row_container* rowContainer,
                                                                   Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor)),
      column_()
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  for (const Entry& entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _insert_entry(entry.get_row_index(), column_.end());
    } else {
      _insert_entry(entry.get_element(), entry.get_row_index(), column_.end());
    }
  }
}